

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  GLint GVar7;
  int iVar8;
  int iVar9;
  GLFWwindow *handle;
  long lVar10;
  GLuint *pGVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  GLfloat x;
  float fVar15;
  float fVar16;
  int height;
  GLsizei log_length;
  int width;
  int local_2064;
  double local_2060;
  undefined1 local_2058 [16];
  double local_2048;
  GLsizei local_203c;
  GLsizei local_2038 [2050];
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x20003,0);
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,2);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x22006,1);
    handle = glfwCreateWindow(800,600,"GLFW OpenGL3 Heightmap demo",(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetKeyCallback(handle,key_callback);
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      GVar3 = make_shader(0x8b31,
                          "#version 150\nuniform mat4 project;\nuniform mat4 modelview;\nin float x;\nin float y;\nin float z;\n\nvoid main()\n{\n   gl_Position = project * modelview * vec4(x, y, z, 1.0);\n}\n"
                         );
      if (GVar3 == 0) {
        fwrite("ERROR: Unable to load vertex shader\n",0x24,1,_stderr);
      }
      else {
        GVar4 = make_shader(0x8b30,
                            "#version 150\nout vec4 color;\nvoid main()\n{\n    color = vec4(0.2, 1.0, 0.2, 1.0); \n}\n"
                           );
        if (GVar4 == 0) {
          fwrite("ERROR: Unable to load fragment shader\n",0x26,1,_stderr);
          (*glad_glDeleteShader)(GVar3);
        }
        else {
          GVar5 = (*glad_glCreateProgram)();
          if (GVar5 != 0) {
            (*glad_glAttachShader)(GVar5,GVar3);
            (*glad_glAttachShader)(GVar5,GVar4);
            (*glad_glLinkProgram)(GVar5);
            (*glad_glGetProgramiv)(GVar5,0x8b82,&local_2064);
            if (local_2064 == 1) {
              (*glad_glUseProgram)(GVar5);
              GVar6 = (*glad_glGetUniformLocation)(GVar5,"project");
              GVar7 = (*glad_glGetUniformLocation)(GVar5,"modelview");
              projection_matrix[0] = 1.3444432;
              projection_matrix[5] = 1.792591;
              projection_matrix[10] = -1.020202;
              projection_matrix[0xb] = -1.0;
              projection_matrix[0xe] = -2.020202;
              iVar2 = 0;
              (*glad_glUniformMatrix4fv)(GVar6,1,'\0',projection_matrix);
              modelview_matrix[0xc] = -5.0;
              modelview_matrix[0xd] = -5.0;
              modelview_matrix[0xe] = -20.0;
              (*glad_glUniformMatrix4fv)(GVar7,1,'\0',modelview_matrix);
              fVar15 = 0.0;
              lVar10 = 0x165ab0;
              do {
                lVar12 = 0;
                fVar16 = 0.0;
                do {
                  *(float *)(lVar10 + -0xc800 + lVar12 * 4) = fVar15;
                  *(undefined4 *)(lVar10 + -0x6400 + lVar12 * 4) = 0;
                  *(float *)(lVar10 + lVar12 * 4) = fVar16;
                  fVar16 = fVar16 + 0.12658228;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 0x50);
                fVar15 = fVar15 + 0.12658228;
                iVar2 = iVar2 + 1;
                lVar10 = lVar10 + 0x140;
              } while (iVar2 != 0x50);
              pGVar11 = map_line_indices + 1;
              GVar3 = 0x9f;
              do {
                pGVar11[-1] = GVar3 - 0x50;
                *pGVar11 = GVar3;
                pGVar11 = pGVar11 + 2;
                GVar3 = GVar3 + 0x50;
              } while (GVar3 != 0x194f);
              lVar10 = 0;
              do {
                map_line_indices[lVar10 * 2 + 0x9e] = (int)lVar10 + 0x18b0;
                map_line_indices[lVar10 * 2 + 0x9f] = (int)lVar10 + 0x18b1;
                lVar10 = lVar10 + 1;
              } while ((int)lVar10 != 0x4f);
              lVar10 = 0x13c;
              iVar2 = 0;
              iVar13 = 0;
              do {
                lVar10 = (long)(int)lVar10;
                iVar14 = 0;
                do {
                  GVar3 = iVar2 + iVar14;
                  map_line_indices[lVar10] = GVar3;
                  map_line_indices[lVar10 + 1] = iVar2 + iVar14 + 1;
                  map_line_indices[lVar10 + 2] = GVar3;
                  map_line_indices[lVar10 + 3] = iVar2 + 0x50 + iVar14;
                  map_line_indices[lVar10 + 4] = GVar3;
                  map_line_indices[lVar10 + 5] = iVar2 + iVar14 + 0x51;
                  lVar10 = lVar10 + 6;
                  iVar14 = iVar14 + 1;
                } while (iVar14 != 0x4f);
                iVar13 = iVar13 + 1;
                iVar2 = iVar2 + 0x50;
              } while (iVar13 != 0x4f);
              (*glad_glGenVertexArrays)(1,&mesh);
              (*glad_glGenBuffers)(4,mesh_vbo);
              (*glad_glBindVertexArray)(mesh);
              (*glad_glBindBuffer)(0x8893,mesh_vbo[3]);
              (*glad_glBufferData)(0x8893,0x24e08,map_line_indices,0x88e4);
              GVar3 = (*glad_glGetAttribLocation)(GVar5,"x");
              (*glad_glBindBuffer)(0x8892,mesh_vbo[0]);
              (*glad_glBufferData)(0x8892,0x6400,map_vertices,0x88e4);
              (*glad_glEnableVertexAttribArray)(GVar3);
              iVar2 = 0;
              (*glad_glVertexAttribPointer)(GVar3,1,0x1406,'\0',0,(void *)0x0);
              GVar3 = (*glad_glGetAttribLocation)(GVar5,"z");
              (*glad_glBindBuffer)(0x8892,mesh_vbo[2]);
              (*glad_glBufferData)(0x8892,0x6400,map_vertices + 2,0x88e4);
              (*glad_glEnableVertexAttribArray)(GVar3);
              (*glad_glVertexAttribPointer)(GVar3,1,0x1406,'\0',0,(void *)0x0);
              GVar3 = (*glad_glGetAttribLocation)(GVar5,"y");
              (*glad_glBindBuffer)(0x8892,mesh_vbo[1]);
              (*glad_glBufferData)(0x8892,0x6400,map_vertices + 1,0x88e8);
              (*glad_glEnableVertexAttribArray)(GVar3);
              (*glad_glVertexAttribPointer)(GVar3,1,0x1406,'\0',0,(void *)0x0);
              glfwGetFramebufferSize(handle,local_2038,&local_2064);
              (*glad_glViewport)(0,0,local_2038[0],local_2064);
              (*glad_glClearColor)(0.0,0.0,0.0,0.0);
              dVar1 = glfwGetTime();
              iVar13 = glfwWindowShouldClose(handle);
              while (iVar13 == 0) {
                (*glad_glClear)(0x4000);
                (*glad_glDrawElements)(1,0x9382,0x1405,(void *)0x0);
                glfwSwapBuffers(handle);
                glfwPollEvents();
                local_2060 = glfwGetTime();
                if ((0.2 < local_2060 - dVar1) && (dVar1 = local_2060, iVar2 < 200)) {
                  iVar13 = rand();
                  iVar14 = rand();
                  iVar8 = rand();
                  iVar9 = rand();
                  local_2058 = ZEXT416((uint)((float)iVar9 * 4.656613e-10));
                  iVar9 = rand();
                  fVar15 = (float)((uint)-(float)iVar9 & -(uint)((float)local_2058._0_4_ < 0.3) |
                                  ~-(uint)((float)local_2058._0_4_ < 0.3) & (uint)(float)iVar9) *
                           4.656613e-10 * 0.5;
                  local_2058._0_8_ = CONCAT44(local_2058._4_4_,fVar15) & 0x80000000ffffffff;
                  local_2058._8_4_ = local_2058._8_4_ & 0x80000000;
                  local_2058._12_4_ = local_2058._12_4_ & 0x80000000;
                  local_2048 = (double)fVar15;
                  lVar10 = -0x6400;
                  do {
                    fVar15 = (float)iVar13 * 10.0 * 4.656613e-10 -
                             *(float *)((long)map_vertices[1] + lVar10);
                    fVar16 = (float)iVar14 * 10.0 * 4.656613e-10 -
                             *(float *)((long)map_line_indices + lVar10);
                    fVar15 = SQRT(fVar15 * fVar15 + fVar16 * fVar16);
                    fVar15 = (fVar15 + fVar15) / ((float)iVar8 * 5.0 * 4.656613e-10);
                    if (ABS(fVar15) <= 1.0) {
                      dVar1 = cos((double)(fVar15 * 3.14));
                      *(float *)((long)map_vertices[2] + lVar10) =
                           (float)(dVar1 * local_2048) + (float)local_2058._0_4_ +
                           *(float *)((long)map_vertices[2] + lVar10);
                    }
                    lVar10 = lVar10 + 4;
                  } while (lVar10 != 0);
                  (*glad_glBufferSubData)(0x8892,0,0x6400,map_vertices + 1);
                  iVar2 = iVar2 + 1;
                  dVar1 = local_2060;
                }
                local_2060 = dVar1;
                iVar13 = glfwWindowShouldClose(handle);
                dVar1 = local_2060;
              }
              glfwTerminate();
              exit(0);
            }
            fwrite("ERROR, failed to link shader program\n",0x25,1,_stderr);
            (*glad_glGetProgramInfoLog)(GVar5,0x2000,&local_203c,(GLchar *)local_2038);
            fprintf(_stderr,"ERROR: \n%s\n\n",local_2038);
            (*glad_glDeleteProgram)(GVar5);
            (*glad_glDeleteShader)(GVar4);
            (*glad_glDeleteShader)(GVar3);
          }
        }
      }
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* window;
    int iter;
    double dt;
    double last_update_time;
    int frame;
    float f;
    GLint uloc_modelview;
    GLint uloc_project;
    int width, height;

    GLuint shader_program;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_RESIZABLE, GLFW_FALSE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_TRUE);

    window = glfwCreateWindow(800, 600, "GLFW OpenGL3 Heightmap demo", NULL, NULL);
    if (! window )
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    /* Register events callback */
    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    /* Prepare opengl resources for rendering */
    shader_program = make_shader_program(vertex_shader_text, fragment_shader_text);

    if (shader_program == 0u)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glUseProgram(shader_program);
    uloc_project   = glGetUniformLocation(shader_program, "project");
    uloc_modelview = glGetUniformLocation(shader_program, "modelview");

    /* Compute the projection matrix */
    f = 1.0f / tanf(view_angle / 2.0f);
    projection_matrix[0]  = f / aspect_ratio;
    projection_matrix[5]  = f;
    projection_matrix[10] = (z_far + z_near)/ (z_near - z_far);
    projection_matrix[11] = -1.0f;
    projection_matrix[14] = 2.0f * (z_far * z_near) / (z_near - z_far);
    glUniformMatrix4fv(uloc_project, 1, GL_FALSE, projection_matrix);

    /* Set the camera position */
    modelview_matrix[12]  = -5.0f;
    modelview_matrix[13]  = -5.0f;
    modelview_matrix[14]  = -20.0f;
    glUniformMatrix4fv(uloc_modelview, 1, GL_FALSE, modelview_matrix);

    /* Create mesh data */
    init_map();
    make_mesh(shader_program);

    /* Create vao + vbo to store the mesh */
    /* Create the vbo to store all the information for the grid and the height */

    /* setup the scene ready for rendering */
    glfwGetFramebufferSize(window, &width, &height);
    glViewport(0, 0, width, height);
    glClearColor(0.0f, 0.0f, 0.0f, 0.0f);

    /* main loop */
    frame = 0;
    iter = 0;
    last_update_time = glfwGetTime();

    while (!glfwWindowShouldClose(window))
    {
        ++frame;
        /* render the next frame */
        glClear(GL_COLOR_BUFFER_BIT);
        glDrawElements(GL_LINES, 2* MAP_NUM_LINES , GL_UNSIGNED_INT, 0);

        /* display and process events through callbacks */
        glfwSwapBuffers(window);
        glfwPollEvents();
        /* Check the frame rate and update the heightmap if needed */
        dt = glfwGetTime();
        if ((dt - last_update_time) > 0.2)
        {
            /* generate the next iteration of the heightmap */
            if (iter < MAX_ITER)
            {
                update_map(NUM_ITER_AT_A_TIME);
                update_mesh();
                iter += NUM_ITER_AT_A_TIME;
            }
            last_update_time = dt;
            frame = 0;
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}